

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyle.cpp
# Opt level: O3

void __thiscall QCachedPainter::finish(QCachedPainter *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  undefined4 extraout_EAX;
  long in_FS_OFFSET;
  int iVar8;
  int iVar9;
  undefined1 local_38 [16];
  double local_28;
  double local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  std::__uniq_ptr_impl<QPainter,_std::default_delete<QPainter>_>::reset
            ((__uniq_ptr_impl<QPainter,_std::default_delete<QPainter>_> *)&this->m_pixmapPainter,
             (pointer)0x0);
  if (this->m_pixmapDrawn == false) {
    this->m_pixmapDrawn = true;
    uVar1 = (this->m_paintRect).x1;
    uVar3 = (this->m_paintRect).y1;
    uVar2 = (this->m_paintRect).x2;
    uVar4 = (this->m_paintRect).y2;
    iVar8 = -(uint)(uVar1 + -1 == uVar2);
    iVar9 = -(uint)(uVar3 + -1 == uVar4);
    auVar7._4_4_ = iVar8;
    auVar7._0_4_ = iVar8;
    auVar7._8_4_ = iVar9;
    auVar7._12_4_ = iVar9;
    iVar8 = movmskpd(extraout_EAX,auVar7);
    if (iVar8 == 3) {
      uVar5 = (this->m_option->rect).x1;
      uVar6 = (this->m_option->rect).y1;
      local_38._8_8_ = (double)(int)uVar6;
      local_38._0_8_ = (double)(int)uVar5;
      QPainter::drawPixmap((QPointF *)this->m_painter,(QPixmap *)local_38);
    }
    else {
      local_38._8_4_ = SUB84((double)(int)uVar3,0);
      local_38._0_8_ = (double)(int)uVar1;
      local_38._12_4_ = (int)((ulong)(double)(int)uVar3 >> 0x20);
      local_28 = (double)(((long)(int)uVar2 - (long)(int)uVar1) + 1);
      local_20 = (double)(((long)(int)uVar4 - (long)(int)uVar3) + 1);
      QPainter::drawPixmap((QRectF *)this->m_painter,(QPixmap *)local_38,(QRectF *)&this->m_pixmap);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCachedPainter::finish()
{
    m_pixmapPainter.reset();
    if (!m_pixmapDrawn) {
        m_pixmapDrawn = true;
        if (m_paintRect.isNull())
            m_painter->drawPixmap(m_option->rect.topLeft(), m_pixmap);
        else
            m_painter->drawPixmap(m_paintRect, m_pixmap);
    }
}